

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<unsigned_long>::abstract_value
          (abstract_value<unsigned_long> *this,unsigned_long *t)

{
  unsigned_long *t_local;
  abstract_value<unsigned_long> *this_local;
  
  Value::Value(&this->super_Value);
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_00257ad8;
  std::shared_ptr<unsigned_long>::shared_ptr(&this->m_result);
  this->m_store = t;
  this->m_default = false;
  this->m_implicit = false;
  std::__cxx11::string::string((string *)&this->m_default_value);
  std::__cxx11::string::string((string *)&this->m_implicit_value);
  return;
}

Assistant:

explicit abstract_value(T* t)
      : m_store(t)
      {
      }